

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

JSON * chaiscript::json::JSONParser::parse_null
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  bool bVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_type *local_20;
  size_t *offset_local;
  string *str_local;
  
  local_20 = offset;
  offset_local = (size_t *)str;
  str_local = (string *)__return_storage_ptr__;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_40,str,*offset,4);
  bVar1 = std::operator==(&local_40,"null");
  std::__cxx11::string::~string((string *)&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    *local_20 = *local_20 + 4;
    memset(__return_storage_ptr__,0,0x28);
    JSON::JSON(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"JSON ERROR: Null: Expected \'null\', found \'",&local_a1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)offset_local,
             *local_20,4);
  std::operator+(&local_80,&local_a0,&local_d8);
  std::operator+(&local_60,&local_80,"\'");
  std::runtime_error::runtime_error(this,(string *)&local_60);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static JSON parse_null(const std::string &str, size_t &offset) {
      if (str.substr(offset, 4) != "null") {
        throw std::runtime_error(std::string("JSON ERROR: Null: Expected 'null', found '") + str.substr(offset, 4) + "'");
      }
      offset += 4;
      return JSON();
    }